

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

void __thiscall
QVarLengthArray<void_*,_32LL>::QVarLengthArray
          (QVarLengthArray<void_*,_32LL> *this,QVarLengthArray<void_*,_32LL> *other)

{
  QVLABaseBase *in_RSI;
  QVarLengthArray<void_*,_32LL> *in_RDI;
  void **in_stack_ffffffffffffffc8;
  
  QVarLengthArray(in_RDI);
  constData((QVarLengthArray<void_*,_32LL> *)0x24feab);
  QVLABaseBase::size(in_RSI);
  append(in_RDI,in_stack_ffffffffffffffc8,0x24fecc);
  return;
}

Assistant:

QVarLengthArray(const QVarLengthArray &other)
        : QVarLengthArray{}
    {
        append(other.constData(), other.size());
    }